

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O3

int randomx_blake2b_init_key(blake2b_state *S,size_t outlen,void *key,size_t keylen)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t uVar8;
  int iVar9;
  uchar *p;
  long lVar10;
  blake2b_param P;
  uint8_t block [128];
  undefined4 local_e8;
  uint auStack_e4 [15];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar9 = -1;
  if (S != (blake2b_state *)0x0) {
    if ((outlen - 0x41 < 0xffffffffffffffc0) ||
       (key == (void *)0x0 || keylen - 0x41 < 0xffffffffffffffc0)) {
      if (S->last_node != '\0') {
        S->f[1] = 0xffffffffffffffff;
      }
      S->f[0] = 0xffffffffffffffff;
    }
    else {
      local_e8._0_1_ = (undefined1)outlen;
      local_e8._1_1_ = (undefined1)keylen;
      local_e8._2_2_ = 0x101;
      auStack_e4[0] = 0;
      auStack_e4[1] = 0;
      auStack_e4[2] = 0;
      auStack_e4[3] = 0;
      auStack_e4[4] = 0;
      auStack_e4[5] = 0;
      auStack_e4[6] = 0;
      auStack_e4[7] = 0;
      auStack_e4[8] = 0;
      auStack_e4[9] = 0;
      auStack_e4[10] = 0;
      auStack_e4[0xb] = 0;
      auStack_e4[0xc] = 0;
      auStack_e4[0xd] = 0;
      auStack_e4[0xe] = 0;
      lVar10 = 0;
      memset(S->t,0,0xb0);
      S->h[0] = 0x6a09e667f3bcc908;
      S->h[1] = 0xbb67ae8584caa73b;
      S->h[2] = 0x3c6ef372fe94f82b;
      S->h[3] = 0xa54ff53a5f1d36f1;
      S->h[4] = 0x510e527fade682d1;
      S->h[5] = 0x9b05688c2b3e6c1f;
      S->h[6] = 0x1f83d9abfb41bd6b;
      S->h[7] = 0x5be0cd19137e2179;
      do {
        uVar3 = auStack_e4[lVar10 * 2];
        uVar4 = auStack_e4[lVar10 * 2 + 1];
        uVar5 = auStack_e4[lVar10 * 2 + 2];
        puVar1 = S->h + lVar10;
        uVar6 = *(uint *)((long)puVar1 + 4);
        uVar8 = puVar1[1];
        uVar7 = *(uint *)((long)puVar1 + 0xc);
        puVar2 = S->h + lVar10;
        *(uint *)puVar2 = (uint)*puVar1 ^ (&local_e8)[lVar10 * 2];
        *(uint *)((long)puVar2 + 4) = uVar6 ^ uVar3;
        *(uint *)(puVar2 + 1) = (uint)uVar8 ^ uVar4;
        *(uint *)((long)puVar2 + 0xc) = uVar7 ^ uVar5;
        lVar10 = lVar10 + 2;
      } while (lVar10 != 8);
      S->outlen = (uint)outlen;
      local_38 = 0;
      uStack_30 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      memcpy(&local_a8,key,keylen);
      randomx_blake2b_update(S,&local_a8,0x80);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int blake2b_init_key(blake2b_state *S, size_t outlen, const void *key, size_t keylen) {
	blake2b_param P;

	if (S == NULL) {
		return -1;
	}

	if ((outlen == 0) || (outlen > BLAKE2B_OUTBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	if ((key == 0) || (keylen == 0) || (keylen > BLAKE2B_KEYBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	/* Setup Parameter Block for keyed BLAKE2 */
	P.digest_length = (uint8_t)outlen;
	P.key_length = (uint8_t)keylen;
	P.fanout = 1;
	P.depth = 1;
	P.leaf_length = 0;
	P.node_offset = 0;
	P.node_depth = 0;
	P.inner_length = 0;
	memset(P.reserved, 0, sizeof(P.reserved));
	memset(P.salt, 0, sizeof(P.salt));
	memset(P.personal, 0, sizeof(P.personal));

	if (blake2b_init_param(S, &P) < 0) {
		blake2b_invalidate_state(S);
		return -1;
	}

	{
		uint8_t block[BLAKE2B_BLOCKBYTES];
		memset(block, 0, BLAKE2B_BLOCKBYTES);
		memcpy(block, key, keylen);
		blake2b_update(S, block, BLAKE2B_BLOCKBYTES);
		/* Burn the key from stack */
		//clear_internal_memory(block, BLAKE2B_BLOCKBYTES);
	}
	return 0;
}